

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O0

void __thiscall
Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
          (DenseStorage<double,__1,__1,__1,_1> *this,Index size,Index rows,Index cols)

{
  double *pdVar1;
  double *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  
  if (in_RSI != in_RDI[1] * in_RDI[2]) {
    internal::conditional_aligned_delete_auto<double,true>(in_RCX,(size_t)in_RDI);
    if (in_RSI == 0) {
      *in_RDI = 0;
    }
    else {
      pdVar1 = internal::conditional_aligned_new_auto<double,true>((size_t)in_RCX);
      *in_RDI = pdVar1;
    }
  }
  in_RDI[1] = in_RDX;
  in_RDI[2] = in_RCX;
  return;
}

Assistant:

EIGEN_DEVICE_FUNC void resize(Index size, Index rows, Index cols)
    {
      if(size != m_rows*m_cols)
      {
        internal::conditional_aligned_delete_auto<T,(_Options&DontAlign)==0>(m_data, m_rows*m_cols);
        if (size)
          m_data = internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size);
        else
          m_data = 0;
        EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN({})
      }
      m_rows = rows;
      m_cols = cols;
    }